

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_ConversionToExpr_Test::TestBody(ExprTest_ConversionToExpr_Test *this)

{
  NumericConstant other;
  NumericConstant n;
  double in_stack_ffffffffffffffe0;
  ExprBase in_stack_ffffffffffffffe8;
  
  other = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                    ((BasicExprFactory<std::allocator<char>_> *)in_stack_ffffffffffffffe8.impl_,
                     in_stack_ffffffffffffffe0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffffffe8.impl_,
             other,other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_.
                   _4_4_);
  TestBody()::Test::f(mp::BasicExpr<(mp::expr::Kind)::Kind_71>_
            ((Expr)in_stack_ffffffffffffffe8.impl_);
  return;
}

Assistant:

TEST_F(ExprTest, ConversionToExpr) {
  // Test that NumericConstant is not convertible to Expr&. If it was
  // convertible there would be an error because of an ambiguous call.
  // The conversion is forbidden because it compromises type safety
  // as illustrated in the following example:
  //   auto n = factory_.MakeNumericConstant(42);
  //   auto u = MakeUnary(expr::ABS, n);
  //   Expr &e = n;
  //   e = u;
  struct Test {
    static void f(Expr) {}
    static void f(Expr &) {}
  };
  auto n = factory_.MakeNumericConstant(42);
  Test::f(n);
}